

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseTemplateParam(State *state)

{
  bool bVar1;
  char *pcVar2;
  State copy;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  char *pcStack_20;
  char *local_18;
  undefined8 uStack_10;
  
  pcVar2 = state->mangled_cur;
  if (*pcVar2 == 'T') {
    if (pcVar2[1] == '_') {
      pcVar2 = pcVar2 + 2;
    }
    else {
      local_38 = state->mangled_cur;
      pcStack_30 = state->out_cur;
      local_28 = state->out_begin;
      pcStack_20 = state->out_end;
      local_18 = state->prev_name;
      uStack_10._0_4_ = state->prev_name_length;
      uStack_10._4_2_ = state->nest_level;
      uStack_10._6_1_ = state->append;
      uStack_10._7_1_ = state->overflowed;
      state->mangled_cur = pcVar2 + 1;
      bVar1 = ParseNumber(state,(int *)0x0);
      if ((!bVar1) || (*state->mangled_cur != '_')) goto LAB_00118a56;
      pcVar2 = state->mangled_cur + 1;
    }
    state->mangled_cur = pcVar2;
    MaybeAppend(state,"?");
    bVar1 = true;
  }
  else {
    local_38 = state->mangled_cur;
    pcStack_30 = state->out_cur;
    local_28 = state->out_begin;
    pcStack_20 = state->out_end;
    local_18 = state->prev_name;
    uStack_10._0_4_ = state->prev_name_length;
    uStack_10._4_2_ = state->nest_level;
    uStack_10._6_1_ = state->append;
    uStack_10._7_1_ = state->overflowed;
LAB_00118a56:
    state->prev_name = local_18;
    state->prev_name_length = (undefined4)uStack_10;
    state->nest_level = uStack_10._4_2_;
    state->append = (bool)uStack_10._6_1_;
    state->overflowed = (bool)uStack_10._7_1_;
    state->out_begin = local_28;
    state->out_end = pcStack_20;
    state->mangled_cur = local_38;
    state->out_cur = pcStack_30;
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool ParseTemplateParam(State *state) {
  if (ParseTwoCharToken(state, "T_")) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;
  }

  State copy = *state;
  if (ParseOneCharToken(state, 'T') && ParseNumber(state, NULL) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support template substitutions.
    return true;
  }
  *state = copy;
  return false;
}